

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O0

TestCaseGroup * vkt::api::createBufferTests(TestContext *testCtx)

{
  uint uVar1;
  BufferCaseParameters testCase;
  TestCaseGroup *pTVar2;
  ostream *poVar3;
  TestNode *this;
  BuffersTestCase *this_00;
  string local_3c0;
  string local_3a0;
  ostringstream local_380 [8];
  ostringstream testDescription;
  ostringstream local_208 [8];
  ostringstream testName;
  BufferCaseParameters testParams;
  deUint32 combinedBufferUsageFlags;
  deUint32 bufferCreateFlagsNdx;
  deUint32 maximumValueOfBufferUsageFlags;
  undefined1 local_68 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> buffersTests;
  VkBufferCreateFlags bufferCreateFlags [5];
  VkBufferUsageFlags bufferUsageModes [9];
  TestContext *testCtx_local;
  
  buffersTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = 0x100000000;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx,"buffer","Buffer Tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&bufferCreateFlagsNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_68,pTVar2
            );
  for (testParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE; testParams.sharingMode < 5;
      testParams.sharingMode = testParams.sharingMode + VK_SHARING_MODE_CONCURRENT) {
    for (testParams.flags = 1; testParams.flags < 0x100; testParams.flags = testParams.flags + 1) {
      uVar1 = bufferCreateFlags[(ulong)testParams.sharingMode - 2];
      std::__cxx11::ostringstream::ostringstream(local_208);
      std::__cxx11::ostringstream::ostringstream(local_380);
      poVar3 = std::operator<<((ostream *)local_208,"create_buffer_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,testParams.flags);
      poVar3 = std::operator<<(poVar3,"_");
      std::ostream::operator<<(poVar3,uVar1);
      poVar3 = std::operator<<((ostream *)local_380,"vkCreateBuffer test ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,testParams.flags);
      poVar3 = std::operator<<(poVar3," ");
      std::ostream::operator<<(poVar3,uVar1);
      this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_68)->super_TestNode;
      this_00 = (BuffersTestCase *)operator_new(0x80);
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::str();
      testCase.flags = uVar1;
      testCase.usage = testParams.flags;
      testCase.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      anon_unknown_0::BuffersTestCase::BuffersTestCase
                (this_00,testCtx,&local_3a0,&local_3c0,testCase);
      tcu::TestNode::addChild(this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::ostringstream::~ostringstream(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_208);
    }
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_68)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_68);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createBufferTests (tcu::TestContext& testCtx)
{
	const VkBufferUsageFlags bufferUsageModes[] =
	{
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,
		VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT,
		VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT,
		VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,
		VK_BUFFER_USAGE_INDEX_BUFFER_BIT,
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,
		VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT
	};

	// \note SPARSE_RESIDENCY and SPARSE_ALIASED have to be used together with the SPARSE_BINDING flag.
	const VkBufferCreateFlags bufferCreateFlags[] =
	{
		0,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|	VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|												VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,
		VK_BUFFER_CREATE_SPARSE_BINDING_BIT	|	VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	|	VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,
	};

	de::MovePtr<tcu::TestCaseGroup>	buffersTests	(new tcu::TestCaseGroup(testCtx, "buffer", "Buffer Tests"));

	const deUint32 maximumValueOfBufferUsageFlags	= (1u << (DE_LENGTH_OF_ARRAY(bufferUsageModes) - 1)) - 1u;

	for (deUint32 bufferCreateFlagsNdx = 0u; bufferCreateFlagsNdx < DE_LENGTH_OF_ARRAY(bufferCreateFlags); bufferCreateFlagsNdx++)
	for (deUint32 combinedBufferUsageFlags = 1u; combinedBufferUsageFlags <= maximumValueOfBufferUsageFlags; combinedBufferUsageFlags++)
	{
		const BufferCaseParameters	testParams =
		{
			combinedBufferUsageFlags,
			bufferCreateFlags[bufferCreateFlagsNdx],
			VK_SHARING_MODE_EXCLUSIVE
		};
		std::ostringstream	testName;
		std::ostringstream	testDescription;
		testName << "create_buffer_" << combinedBufferUsageFlags << "_" << testParams.flags;
		testDescription << "vkCreateBuffer test " << combinedBufferUsageFlags << " " << testParams.flags;
		buffersTests->addChild(new BuffersTestCase(testCtx, testName.str(), testDescription.str(), testParams));
	}

	return buffersTests.release();
}